

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

GLvoid __thiscall
glcts::anon_unknown_0::GatherBase::CreateTexture2D(GatherBase *this,bool base_level)

{
  CallLogWrapper *pCVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  int iVar4;
  uint uVar5;
  uint level;
  undefined7 in_register_00000031;
  GLenum GVar6;
  GLenum format;
  allocator_type local_a1;
  uint local_a0;
  uint local_9c;
  CallLogWrapper *local_98;
  undefined8 local_90;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixels;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Vector<float,_4> local_40;
  
  local_9c = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])();
  iVar3 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x22])(this);
  local_90 = CONCAT44(extraout_var,iVar3);
  local_a0 = (uint)CONCAT71(in_register_00000031,base_level);
  iVar4 = local_a0 * 0x20;
  iVar3 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])(this);
  GVar6 = (uint)(iVar3 != 0x8c43) * 5 + 0x1401;
  pCVar1 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(pCVar1,1,&this->tex);
  local_98 = pCVar1;
  glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,this->tex);
  iVar3 = 0;
  for (uVar5 = iVar4 + 0x20; pCVar1 = local_98, uVar5 != 0; uVar5 = uVar5 >> 1) {
    tcu::Vector<float,_4>::Vector(&local_40,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &pixels.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>,
               (ulong)(uVar5 * uVar5),&local_40,&local_a1);
    glu::CallLogWrapper::glTexImage2D
              (local_98,0xde1,iVar3,local_9c,uVar5,uVar5,0,(GLenum)local_90,GVar6,
               pixels.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&pixels.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    iVar3 = iVar3 + 1;
  }
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3f5000003f400000;
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3f7000003f600000;
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3f1000003f000000;
  local_68 = 0x3d80000000000000;
  uStack_60 = 0x3e4000003e000000;
  local_58 = 0x3ea000003e800000;
  uStack_50 = 0x3ee000003ec00000;
  uVar5 = local_a0 & 0xff;
  level = local_a0 & 0xff;
  format = (GLenum)local_90;
  glu::CallLogWrapper::glTexSubImage2D
            (local_98,0xde1,uVar5,0x16,0x19,2,2,format,GVar6,
             &pixels.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  glu::CallLogWrapper::glTexSubImage2D
            (pCVar1,0xde1,level,0x10,10,1,1,format,GVar6,
             &pixels.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  glu::CallLogWrapper::glTexSubImage2D
            (pCVar1,0xde1,uVar5,0xb,2,1,1,format,GVar6,
             &pixels.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::glTexSubImage2D(pCVar1,0xde1,uVar5,0x18,0xd,1,1,format,GVar6,&local_68);
  glu::CallLogWrapper::glTexSubImage2D(pCVar1,0xde1,uVar5,9,0xe,1,1,format,GVar6,&local_58);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2803,0x812f);
  GVar6 = 0xde1;
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x8072,0x812f);
  bVar2 = IsFloatingPointTexture((GatherBase *)(ulong)local_9c,GVar6);
  pCVar1 = local_98;
  if (bVar2) {
    glu::CallLogWrapper::glTexParameteri(local_98,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2700);
  }
  if ((char)local_a0 != '\0') {
    glu::CallLogWrapper::glTexParameteri(local_98,0xde1,0x813c,1);
  }
  return;
}

Assistant:

virtual GLvoid CreateTexture2D(bool base_level = false)
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= Format();
		const GLint csize			= base_level ? 64 : 32;
		GLint		size			= csize;
		GLenum		target			= GL_TEXTURE_2D;
		GLenum		tex_type		= InternalFormat() == GL_SRGB8_ALPHA8 ? GL_UNSIGNED_BYTE : GL_FLOAT;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			std::vector<Vec4> pixels(size * size, Vec4(1.0));
			glTexImage2D(target, i, internal_format, size, size, 0, format, tex_type, &pixels[0]);
		}

		Vec4 data[4] = { Vec4(12. / 16, 13. / 16, 14. / 16, 15. / 16), Vec4(8. / 16, 9. / 16, 10. / 16, 11. / 16),
						 Vec4(0. / 16, 1. / 16, 2. / 16, 3. / 16), Vec4(4. / 16, 5. / 16, 6. / 16, 7. / 16) };

		glTexSubImage2D(target, base_level, 22, 25, 2, 2, format, tex_type, data);
		glTexSubImage2D(target, base_level, 16, 10, 1, 1, format, tex_type, data + 0);
		glTexSubImage2D(target, base_level, 11, 2, 1, 1, format, tex_type, data + 1);
		glTexSubImage2D(target, base_level, 24, 13, 1, 1, format, tex_type, data + 2);
		glTexSubImage2D(target, base_level, 9, 14, 1, 1, format, tex_type, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);

		if (IsFloatingPointTexture(internal_format))
		{
			glTexParameteri(target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexParameteri(target, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
		}

		if (base_level)
			glTexParameteri(target, GL_TEXTURE_BASE_LEVEL, 1);
	}